

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

bool TS_program_map_section::isFullBuff(uint8_t *buffer,int buf_size)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  BitStreamReader bitReader;
  BitStreamReader local_28;
  
  local_28.super_BitStream.m_totalBits = 0;
  local_28.super_BitStream.m_buffer = (uint *)0x0;
  local_28.super_BitStream.m_initBuffer = (uint *)0x0;
  local_28.m_curVal = 0;
  local_28.m_bitLeft = 0;
  BitStream::setBuffer(&local_28.super_BitStream,buffer + (ulong)*buffer + 1,buffer + buf_size);
  local_28._24_8_ = local_28._24_8_ & 0xffffffff;
  local_28.m_curVal = BitStreamReader::getCurVal(&local_28,local_28.super_BitStream.m_buffer);
  local_28.m_bitLeft = 0x20;
  uVar2 = BitStreamReader::getBits(&local_28,8);
  if (((char)uVar2 == '\x02') &&
     (uVar2 = BitStreamReader::getBits(&local_28,2), (char)uVar2 == '\x02')) {
    BitStreamReader::skipBits(&local_28,2);
    uVar2 = BitStreamReader::getBits(&local_28,0xc);
    iVar3 = ((int)local_28.super_BitStream.m_buffer - (int)local_28.super_BitStream.m_initBuffer) *
            8 - local_28.m_bitLeft;
    iVar1 = iVar3 + 0x20;
    iVar3 = iVar3 + 0x27;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    return (uint8_t *)
           ((long)local_28.super_BitStream.m_initBuffer +
           (long)(iVar3 >> 3) + (ulong)(uVar2 & 0xffff)) <= buffer + buf_size;
  }
  return false;
}

Assistant:

bool TS_program_map_section::isFullBuff(uint8_t* buffer, const int buf_size)
{
    const uint8_t pointerField = *buffer;
    const uint8_t* bufEnd = buffer + buf_size;
    BitStreamReader bitReader{};
    try
    {
        bitReader.setBuffer(buffer + 1 + pointerField, buffer + buf_size);

        const auto table_id = bitReader.getBits<uint8_t>(8);
        if (table_id != 0x02)
            return false;

        const auto indicator = bitReader.getBits<uint8_t>(2);  // section syntax indicator and reserved '0' bit
        if (indicator != 2)
            return false;
        bitReader.skipBits(2);  // reserved

        const auto section_length = bitReader.getBits<uint16_t>(12);
        return bitReader.getBuffer() + bitReader.getBitsCount() / 8 + section_length <= bufEnd;
    }
    catch (BitStreamException&)
    {
        return false;
    }
}